

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_modify_passwords_file_ha1(char *fname,char *domain,char *user,char *ha1)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  size_t sVar5;
  FILE *pFVar6;
  size_t sVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  uint local_5f4;
  void *local_5f0;
  stat st;
  char d [256];
  char u [256];
  char h [256];
  char line [512];
  
  memset(&st,0,0x90);
  pcVar12 = (char *)0x0;
  if ((ha1 != (char *)0x0) && (*ha1 != '\0')) {
    pcVar12 = ha1;
  }
  if (user == (char *)0x0 || (domain == (char *)0x0 || fname == (char *)0x0)) {
    return 0;
  }
  pcVar3 = strchr(user,0x3a);
  if (pcVar3 != (char *)0x0) {
    return 0;
  }
  pcVar3 = strchr(domain,0x3a);
  if (pcVar3 != (char *)0x0) {
    return 0;
  }
  for (lVar11 = 0; (lVar11 != 0xff && (bVar1 = user[lVar11], (ulong)bVar1 != 0));
      lVar11 = lVar11 + 1) {
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[bVar1] & 2) != 0) {
      return 0;
    }
  }
  if (user[lVar11] != '\0') {
    return 0;
  }
  for (lVar11 = 0; (lVar11 != 0xff && (bVar1 = domain[lVar11], (ulong)bVar1 != 0));
      lVar11 = lVar11 + 1) {
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[bVar1] & 2) != 0) {
      return 0;
    }
  }
  if (domain[lVar11] != '\0') {
    return 0;
  }
  sVar5 = strlen(fname);
  if (0xfff < sVar5) {
    return 0;
  }
  iVar2 = stat64(fname,(stat64 *)&st);
  if (iVar2 == 0) {
    uVar8 = 0;
    if (0xa00000 < st.st_size) {
      return 0;
    }
    local_5f0 = calloc((long)((int)st.st_size + 0x400),1);
    if (local_5f0 == (void *)0x0) {
      return 0;
    }
    pFVar6 = fopen64(fname,"r");
    if (pFVar6 != (FILE *)0x0) {
      local_5f4 = 0;
      bVar9 = false;
LAB_0010edba:
      do {
        pcVar3 = fgets(line,0x200,pFVar6);
        if ((pcVar3 == (char *)0x0) || ((int)st.st_size + 0x1a8 <= (int)local_5f4))
        goto LAB_0010eef0;
        iVar2 = __isoc99_sscanf(line,"%255[^:]:%255[^:]:%255s",u,d,h);
      } while (iVar2 != 3);
      u[0xff] = '\0';
      d[0xff] = '\0';
      h[0xff] = '\0';
      iVar2 = strcmp(u,user);
      if ((iVar2 == 0) && (iVar2 = strcmp(d,domain), iVar2 == 0)) {
        bVar13 = pcVar12 == (char *)0x0 || bVar9;
        bVar9 = true;
        if (bVar13) goto LAB_0010edba;
        iVar2 = sprintf((char *)((ulong)local_5f4 + (long)local_5f0),"%s:%s:%s\n",user,domain,
                        pcVar12);
        if (0 < iVar2) {
          local_5f4 = local_5f4 + iVar2;
          goto LAB_0010edba;
        }
      }
      else {
        iVar2 = sprintf((char *)((ulong)local_5f4 + (long)local_5f0),"%s:%s:%s\n",u,d,h);
        if (0 < iVar2) {
          local_5f4 = local_5f4 + iVar2;
          goto LAB_0010edba;
        }
      }
      fclose(pFVar6);
      goto LAB_0010ef12;
    }
    goto LAB_0010ed39;
  }
  bVar9 = false;
  local_5f0 = (void *)0x0;
  sVar5 = 0;
LAB_0010ec91:
  pFVar6 = fopen64(fname,"w");
  if (pFVar6 == (FILE *)0x0) {
LAB_0010ef12:
    free(local_5f0);
    return 0;
  }
  iVar2 = fileno(pFVar6);
  iVar2 = fchmod(iVar2,0x180);
  uVar10 = (uint)(iVar2 == 0);
  if (((local_5f0 != (void *)0x0) && (0 < (int)sVar5)) &&
     (sVar7 = fwrite(local_5f0,1,sVar5,pFVar6), sVar7 != sVar5)) {
    uVar10 = 0;
  }
  if (pcVar12 != (char *)0x0 && !bVar9) {
    iVar2 = fprintf(pFVar6,"%s:%s:%s\n",user,domain,pcVar12);
    if (iVar2 < 6) {
      uVar10 = 0;
    }
  }
  iVar2 = fclose(pFVar6);
  uVar8 = 0;
  if (iVar2 == 0) {
    uVar8 = uVar10;
  }
LAB_0010ed39:
  free(local_5f0);
  return uVar8;
LAB_0010eef0:
  fclose(pFVar6);
  sVar5 = (size_t)local_5f4;
  goto LAB_0010ec91;
}

Assistant:

CIVETWEB_API int
mg_modify_passwords_file_ha1(const char *fname,
                             const char *domain,
                             const char *user,
                             const char *ha1)
{
	int found = 0, i, result = 1;
	char line[512], u[256], d[256], h[256];
	struct stat st = {0};
	FILE *fp = NULL;
	char *temp_file = NULL;
	int temp_file_offs = 0;

	/* Regard empty password as no password - remove user record. */
	if ((ha1 != NULL) && (ha1[0] == '\0')) {
		ha1 = NULL;
	}

	/* Other arguments must not be empty */
	if ((fname == NULL) || (domain == NULL) || (user == NULL)) {
		return 0;
	}

	/* Using the given file format, user name and domain must not contain
	 * the ':' character */
	if (strchr(user, ':') != NULL) {
		return 0;
	}
	if (strchr(domain, ':') != NULL) {
		return 0;
	}

	/* Do not allow control characters like newline in user name and domain.
	 * Do not allow excessively long names either. */
	for (i = 0; ((i < 255) && (user[i] != 0)); i++) {
		if (iscntrl((unsigned char)user[i])) {
			return 0;
		}
	}
	if (user[i]) {
		return 0; /* user name too long */
	}
	for (i = 0; ((i < 255) && (domain[i] != 0)); i++) {
		if (iscntrl((unsigned char)domain[i])) {
			return 0;
		}
	}
	if (domain[i]) {
		return 0; /* domain name too long */
	}

	/* The maximum length of the path to the password file is limited */
	if (strlen(fname) >= UTF8_PATH_MAX) {
		return 0;
	}

	/* Check if the file exists, and get file size */
	if (0 == stat(fname, &st)) {
		int temp_buf_len;
		if (st.st_size > 10485760) {
			/* Some funster provided a >10 MB text file */
			return 0;
		}

		/* Add enough space for one more line */
		temp_buf_len = (int)st.st_size + 1024;

		/* Allocate memory (instead of using a temporary file) */
		temp_file = (char *)mg_calloc((size_t)temp_buf_len, 1);
		if (!temp_file) {
			/* Out of memory */
			return 0;
		}

		/* File exists. Read it into a memory buffer. */
		fp = fopen(fname, "r");
		if (fp == NULL) {
			/* Cannot read file. No permission? */
			mg_free(temp_file);
			return 0;
		}

		/* Read content and store in memory */
		while ((fgets(line, sizeof(line), fp) != NULL)
		       && ((temp_file_offs + 600) < temp_buf_len)) {
			/* file format is "user:domain:hash\n" */
			if (sscanf(line, "%255[^:]:%255[^:]:%255s", u, d, h) != 3) {
				continue;
			}
			u[255] = 0;
			d[255] = 0;
			h[255] = 0;

			if (!strcmp(u, user) && !strcmp(d, domain)) {
				/* Found the user: change the password hash or drop the user
				 */
				if ((ha1 != NULL) && (!found)) {
					i = sprintf(temp_file + temp_file_offs,
					            "%s:%s:%s\n",
					            user,
					            domain,
					            ha1);
					if (i < 1) {
						fclose(fp);
						mg_free(temp_file);
						return 0;
					}
					temp_file_offs += i;
				}
				found = 1;
			} else {
				/* Copy existing user, including password hash */
				i = sprintf(temp_file + temp_file_offs, "%s:%s:%s\n", u, d, h);
				if (i < 1) {
					fclose(fp);
					mg_free(temp_file);
					return 0;
				}
				temp_file_offs += i;
			}
		}
		fclose(fp);
	}

	/* Create new file */
	fp = fopen(fname, "w");
	if (!fp) {
		mg_free(temp_file);
		return 0;
	}

#if !defined(_WIN32)
	/* On Linux & co., restrict file read/write permissions to the owner */
	if (fchmod(fileno(fp), S_IRUSR | S_IWUSR) != 0) {
		result = 0;
	}
#endif

	if ((temp_file != NULL) && (temp_file_offs > 0)) {
		/* Store buffered content of old file */
		if (fwrite(temp_file, 1, (size_t)temp_file_offs, fp)
		    != (size_t)temp_file_offs) {
			result = 0;
		}
	}

	/* If new user, just add it */
	if ((ha1 != NULL) && (!found)) {
		if (fprintf(fp, "%s:%s:%s\n", user, domain, ha1) < 6) {
			result = 0;
		}
	}

	/* All data written */
	if (fclose(fp) != 0) {
		result = 0;
	}

	mg_free(temp_file);
	return result;
}